

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::writePixelData
               (OutputStreamMutex *filedata,Data *partdata,int lineBufferMinY,char *pixelData,
               int pixelDataSize)

{
  int iVar1;
  reference pvVar2;
  long lVar3;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  Int64 currentPosition;
  undefined8 in_stack_ffffffffffffffb8;
  OStream *in_stack_ffffffffffffffc0;
  undefined8 local_30;
  
  local_30 = *(value_type *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  if (local_30 == 0) {
    local_30 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))();
  }
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x98),
                      (long)((*(int *)(in_RSI + 0x78) - *(int *)(in_RSI + 0x8c)) /
                            *(int *)(in_RSI + 0x120)));
  *pvVar2 = local_30;
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((*(byte *)(in_RSI + 0x38) & 1) != 0) {
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_stack_ffffffffffffffc0,iVar1);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_stack_ffffffffffffffc0,iVar1);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_stack_ffffffffffffffc0,iVar1);
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),in_RCX,in_R8D);
  iVar1 = Xdr::size<int>();
  lVar3 = local_30 + (long)iVar1;
  iVar1 = Xdr::size<int>();
  *(long *)(in_RDI + 0x30) = lVar3 + iVar1 + (long)in_R8D;
  if ((*(byte *)(in_RSI + 0x38) & 1) != 0) {
    iVar1 = Xdr::size<int>();
    *(long *)(in_RDI + 0x30) = (long)iVar1 + *(long *)(in_RDI + 0x30);
  }
  return;
}

Assistant:

void
writePixelData (OutputStreamMutex *filedata,
                OutputFile::Data *partdata,
                int lineBufferMinY,
                const char pixelData[],
                int pixelDataSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file
    // without calling tellp() (tellp() can be fairly expensive).
    //

    Int64 currentPosition = filedata->currentPosition;
    filedata->currentPosition = 0;

    if (currentPosition == 0)
        currentPosition = filedata->os->tellp();

    partdata->lineOffsets[(partdata->currentScanLine - partdata->minY) / partdata->linesInBuffer] =
        currentPosition;

    #ifdef DEBUG

        assert (filedata->os->tellp() == currentPosition);

    #endif
    
	
	
    if (partdata->multiPart)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*filedata->os, partdata->partNumber);
    }
    
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*filedata->os, lineBufferMinY);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*filedata->os, pixelDataSize);
    filedata->os->write (pixelData, pixelDataSize);

    filedata->currentPosition = currentPosition +
                           Xdr::size<int>() +
                           Xdr::size<int>() +
                           pixelDataSize;

    if (partdata->multiPart)
    {
        filedata->currentPosition += Xdr::size<int>();
    }
}